

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O1

deInt32 vkt::texture::util::wrapTexelCoord(deInt32 coord,int size,VkSamplerAddressMode wrap)

{
  deInt32 dVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  switch(wrap) {
  case VK_SAMPLER_ADDRESS_MODE_REPEAT:
    return (coord % size >> 0x1f & size) + coord % size;
  case VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT:
    iVar3 = coord % (size * 2);
    uVar4 = (iVar3 - size) + (iVar3 >> 0x1f & size * 2);
    return ~((int)uVar4 >> 0x1f ^ uVar4) + size;
  case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE:
    uVar4 = size - 1U;
    if (coord < (int)(size - 1U)) {
      uVar4 = coord;
    }
    bVar5 = coord < 0;
    break;
  case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER:
    if (coord < size) {
      size = coord;
    }
    dVar1 = -1;
    if (-2 < coord) {
      dVar1 = size;
    }
    return dVar1;
  case VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE:
    uVar2 = coord >> 0x1f ^ coord;
    uVar4 = size - 1U;
    if ((int)uVar2 < (int)(size - 1U)) {
      uVar4 = uVar2;
    }
    bVar5 = (int)uVar2 < 0;
    break;
  default:
    return 0;
  }
  uVar2 = 0;
  if (!bVar5) {
    uVar2 = uVar4;
  }
  return uVar2;
}

Assistant:

deInt32 wrapTexelCoord (const deInt32 coord,
						const int size,
						const VkSamplerAddressMode wrap)
{
	deInt32 wrappedCoord = 0;

	switch (wrap)
	{
		case VK_SAMPLER_ADDRESS_MODE_REPEAT:
			wrappedCoord = mod(coord, size);
			break;

		case VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT:
			wrappedCoord = (size - 1) - mirror(mod(coord, 2 * size) - size);
			break;

		case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE:
			wrappedCoord = de::clamp(coord, 0, (deInt32) size - 1);
			break;

		case VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER:
			wrappedCoord = de::clamp(coord, -1, (deInt32) size);
			break;

		case VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE:
			wrappedCoord = de::clamp(mirror(coord), 0, (deInt32) size - 1);
			break;

		default:
			DE_FATAL("Invalid VkSamplerAddressMode");
			break;
	}

	return wrappedCoord;
}